

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::MapWriteOnlyTest::iterate(MapWriteOnlyTest *this)

{
  GLboolean GVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  undefined4 *puVar5;
  TestContext *pTVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  MessageBuilder local_4e0;
  int local_35c;
  undefined1 local_358 [4];
  GLsizei i_1;
  int local_1d4;
  undefined1 local_1d0 [4];
  GLsizei i;
  void *local_50;
  GLuint *data;
  GLuint local_34;
  byte local_2f;
  byte local_2e;
  undefined1 local_2d;
  GLuint buffer;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  MapWriteOnlyTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar4->_vptr_RenderContext[2])();
  buffer = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)buffer);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_2d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)local_2d)) {
    local_2e = 1;
    local_2f = 0;
    local_34 = 0;
    this->m_pNamedBufferData = *(PFNGLNAMEDBUFFERDATA *)(lStack_20 + 0xec0);
    this->m_pMapNamedBuffer = *(PFNGLMAPNAMEDBUFFER *)(lStack_20 + 0xd08);
    this->m_pUnmapNamedBuffer = *(PFNGLUNMAPNAMEDBUFFER *)(lStack_20 + 0x1678);
    if ((this->m_pNamedBufferData == (PFNGLNAMEDBUFFERDATA)0x0) ||
       ((this->m_pMapNamedBuffer == (PFNGLMAPNAMEDBUFFER)0x0 ||
        (this->m_pUnmapNamedBuffer == (PFNGLUNMAPNAMEDBUFFER)0x0)))) {
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 0;
      __cxa_throw(puVar5,&int::typeinfo,0);
    }
    (**(code **)(lStack_20 + 0x3b8))(1,&local_34);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x5f5);
    (*this->m_pNamedBufferData)(local_34,0x34,(GLvoid *)0x0,0x88ea);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glNamedBufferData failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x5f9);
    local_50 = (*this->m_pMapNamedBuffer)(local_34,0x88b9);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glMapNamedBuffer failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x5fd);
    if (local_50 == (void *)0x0) {
      pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar7 = tcu::TestContext::getLog(pTVar6);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_1d0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1d0,
                          (char (*) [72])
                          "glMapNamedBuffer returned NULL pointer, but buffer\'s data was expected."
                         );
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1d0);
    }
    else {
      for (local_1d4 = 0; local_1d4 < 0xd; local_1d4 = local_1d4 + 1) {
        *(undefined4 *)((long)local_50 + (long)local_1d4 * 4) =
             *(undefined4 *)(s_reference + (long)local_1d4 * 4);
      }
      GVar1 = (*this->m_pUnmapNamedBuffer)(local_34);
      if (GVar1 != '\x01') {
        local_2e = 0;
        pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar7 = tcu::TestContext::getLog(pTVar6);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_358,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_358,
                            (char (*) [92])
                            "glUnmapNamedBuffer called on mapped buffer has returned GL_FALSE, but GL_TRUE was expected."
                           );
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_358);
      }
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"glUnmapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x619);
      (**(code **)(lStack_20 + 0x40))(0x8892,local_34);
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"glBindBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x61d);
      local_50 = (void *)0x0;
      local_50 = (void *)(**(code **)(lStack_20 + 0xcf8))(0x8892,35000);
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"glMapBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x622);
      for (local_35c = 0; local_35c < 0xd; local_35c = local_35c + 1) {
        local_2e = (local_2e & 1 &
                   *(int *)((long)local_50 + (long)local_35c * 4) ==
                   *(int *)(s_reference + (long)local_35c * 4)) != 0;
      }
      if ((local_2e & 1) == 0) {
        pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar7 = tcu::TestContext::getLog(pTVar6);
        tcu::TestLog::operator<<(&local_4e0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_4e0,
                            (char (*) [92])
                            "glMapNamedBuffer, called with GL_WRITE_ONLY access flag, had not stored the reference data."
                           );
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4e0);
      }
      (**(code **)(lStack_20 + 0x1670))(0x8892);
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"glUnmapBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x634);
    }
    if (local_34 != 0) {
      (**(code **)(lStack_20 + 0x438))(1);
      local_34 = 0;
    }
    do {
      iVar2 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar2 != 0);
    if ((local_2e & 1) == 0) {
      if ((local_2f & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MapWriteOnlyTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	glw::GLuint buffer = 0;

	m_pNamedBufferData  = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pMapNamedBuffer   = (PFNGLMAPNAMEDBUFFER)gl.mapNamedBuffer;
	m_pUnmapNamedBuffer = (PFNGLUNMAPNAMEDBUFFER)gl.unmapNamedBuffer;

	try
	{
		if ((DE_NULL == m_pNamedBufferData) || (DE_NULL == m_pMapNamedBuffer) || (DE_NULL == m_pUnmapNamedBuffer))
		{
			throw 0;
		}

		/* Buffer creation. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		/* Buffer's storage allocation. */
		m_pNamedBufferData(buffer, s_reference_size, NULL, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData failed.");

		/* Mapping with new named buffer map function. */
		glw::GLuint* data = (glw::GLuint*)m_pMapNamedBuffer(buffer, GL_WRITE_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

		if (DE_NULL == data)
		{
			/* Log. */
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glMapNamedBuffer returned NULL pointer, but buffer's data was expected."
				<< tcu::TestLog::EndMessage;
		}
		else
		{
			/* Reference data upload. */
			for (glw::GLsizei i = 0; i < s_reference_count; ++i)
			{
				data[i] = s_reference[i];
			}

			/* Unmapping with new named buffer unmap function. */
			if (GL_TRUE != m_pUnmapNamedBuffer(buffer))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glUnmapNamedBuffer called on mapped buffer has returned GL_FALSE, but GL_TRUE was expected."
					<< tcu::TestLog::EndMessage;
			}
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");

			/* Mapping data, the old way. */
			gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer failed.");

			data = DE_NULL;

			data = (glw::GLuint*)gl.mapBuffer(GL_ARRAY_BUFFER, GL_READ_ONLY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer failed.");

			/* Comparison results with reference data. */
			for (glw::GLsizei i = 0; i < s_reference_count; ++i)
			{
				is_ok &= (data[i] == s_reference[i]);
			}

			if (!is_ok)
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glMapNamedBuffer, called with GL_WRITE_ONLY access flag, had not stored the reference data."
					<< tcu::TestLog::EndMessage;
			}

			gl.unmapBuffer(GL_ARRAY_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer failed.");
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = false;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}